

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O2

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::fromFirst
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  int iVar1;
  uint uVar2;
  char in_CL;
  uint _length;
  undefined7 in_register_00000011;
  undefined8 extraout_RDX;
  char *_data;
  int iVar3;
  VerySimpleReadOnlyString VVar4;
  
  uVar2 = Find(find,(VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind),0);
  _data = find->data;
  _length = find->length - uVar2;
  if (_length == 0) {
    if (in_CL == '\0') {
      _data = "";
    }
    _length = 0;
    if (in_CL != '\0') {
      _length = uVar2;
    }
  }
  else {
    iVar1 = ((VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind))->length;
    iVar3 = 0;
    if (in_CL == '\0') {
      iVar3 = iVar1;
    }
    _data = _data + (iVar3 + uVar2);
    if (in_CL == '\0') {
      _length = find->length - (uVar2 + iVar1);
    }
  }
  VerySimpleReadOnlyString(this,_data,_length);
  VVar4._8_8_ = extraout_RDX;
  VVar4.data = (tCharPtr)this;
  return VVar4;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::fromFirst(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = Find(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length ? (includeFind ? data : "") : &data[includeFind ? pos : pos + (unsigned int)find.length],
	                                    pos == (unsigned int)length ? (includeFind ? (unsigned int)length : 0)
	                                                      : (includeFind ? (unsigned int)length - pos
	                                                                  : (unsigned int)length - pos - (unsigned int)find.length));
	}